

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.cc
# Opt level: O2

void __thiscall gss::Timeout::Timeout(Timeout *this,seconds limit)

{
  thread local_20;
  long *local_18;
  
  std::make_unique<gss::Timeout::Detail>();
  LOCK();
  (((this->_detail)._M_t.
    super___uniq_ptr_impl<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>._M_t.
    super__Tuple_impl<0UL,_gss::Timeout::Detail_*,_std::default_delete<gss::Timeout::Detail>_>.
    super__Head_base<0UL,_gss::Timeout::Detail_*,_false>._M_head_impl)->abort)._M_base =
       (__atomic_base<bool>)0x0;
  UNLOCK();
  if (limit.__r != 0) {
    local_20._M_id._M_thread = (id)0;
    local_18 = (long *)operator_new(0x18);
    *local_18 = (long)&PTR___State_001d0438;
    local_18[1] = limit.__r;
    local_18[2] = (long)this;
    std::thread::_M_start_thread(&local_20,&local_18,0);
    if (local_18 != (long *)0x0) {
      (**(code **)(*local_18 + 8))();
    }
    std::thread::operator=
              (&((this->_detail)._M_t.
                 super___uniq_ptr_impl<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::Timeout::Detail_*,_std::default_delete<gss::Timeout::Detail>_>
                 .super__Head_base<0UL,_gss::Timeout::Detail_*,_false>._M_head_impl)->timeout_thread
               ,&local_20);
    std::thread::~thread(&local_20);
  }
  return;
}

Assistant:

Timeout::Timeout(const seconds limit) :
    _detail(make_unique<Detail>())
{
    _detail->abort.store(false);
    if (0s != limit) {
        _detail->timeout_thread = thread([limit, &detail = this->_detail] {
            auto abort_time = system_clock::now() + limit;
            {
                /* Sleep until either we've reached the time limit,
                 * or we've finished all the work. */
                unique_lock<mutex> guard(detail->timeout_mutex);
                while (! detail->abort.load()) {
                    if (cv_status::timeout == detail->timeout_cv.wait_until(guard, abort_time)) {
                        /* We've woken up, and it's due to a timeout. */
                        detail->aborted = true;
                        break;
                    }
                }
            }
            detail->abort.store(true);
        });
    }
}